

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfObserver::summary(TFProfObserver *this,ostream *os)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  unsigned_long *puVar7;
  ostream *poVar8;
  size_t sVar9;
  TFProfObserver *this_00;
  Summary *this_01;
  ostream *in_RSI;
  long in_RDI;
  size_t view;
  value_type *y;
  value_type *x;
  size_t t;
  value_type *s;
  size_t i;
  WorkerSummary ws;
  size_t l;
  size_t w;
  size_t first;
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  view_end;
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  view_beg;
  Summary summary;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffc58;
  Summary *in_stack_fffffffffffffc60;
  value_type *in_stack_fffffffffffffc68;
  TFProfObserver *in_stack_fffffffffffffc70;
  size_t local_340;
  size_t local_338;
  size_t local_330;
  size_t local_328;
  size_t local_320;
  size_t local_318;
  duration<long,_std::ratio<1L,_1000000L>_> local_2a8;
  ulong local_2a0;
  reference local_298;
  reference local_290;
  rep local_288;
  duration<long,_std::ratio<1L,_1000000L>_> local_280;
  size_t local_278 [3];
  const_reference local_260;
  ulong local_258;
  size_type local_250;
  size_type local_248;
  size_type local_240;
  long local_238;
  size_t local_230;
  size_t local_228 [29];
  ulong local_140;
  size_type local_138;
  ulong local_130;
  ostream *local_10;
  
  local_10 = in_RSI;
  Summary::Summary(in_stack_fffffffffffffc60);
  std::
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::optional((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
              *)0x11dde1);
  std::
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ::optional((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
              *)0x11ddee);
  for (local_130 = 0; uVar1 = local_130,
      sVar3 = std::
              vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
              ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                      *)(in_RDI + 0x18)), uVar1 < sVar3; local_130 = local_130 + 1) {
    pvVar4 = std::
             vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                           *)(in_RDI + 0x18),local_130);
    sVar3 = std::
            vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
            ::size(pvVar4);
    if (sVar3 != 0) break;
  }
  uVar1 = local_130;
  sVar3 = std::
          vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
          ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                  *)(in_RDI + 0x18));
  if (uVar1 != sVar3) {
    for (local_138 = local_130; sVar3 = local_138,
        sVar5 = std::
                vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ::size((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                        *)(in_RDI + 0x18)), sVar3 < sVar5; local_138 = local_138 + 1) {
      local_140 = 0;
      while( true ) {
        uVar1 = local_140;
        pvVar4 = std::
                 vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                               *)(in_RDI + 0x18),local_138);
        sVar3 = std::
                vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                ::size(pvVar4);
        if (sVar3 <= uVar1) break;
        pvVar4 = std::
                 vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                               *)(in_RDI + 0x18),local_138);
        std::
        vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
        ::operator[](pvVar4,local_140);
        bVar2 = std::vector<tf::Segment,_std::allocator<tf::Segment>_>::empty
                          ((vector<tf::Segment,_std::allocator<tf::Segment>_> *)
                           in_stack_fffffffffffffc70);
        if (!bVar2) {
          WorkerSummary::WorkerSummary((WorkerSummary *)0x11df99);
          local_250 = local_138;
          local_248 = local_140;
          pvVar4 = std::
                   vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                 *)(in_RDI + 0x18),local_138);
          pvVar6 = std::
                   vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                   ::operator[](pvVar4,local_140);
          local_240 = std::vector<tf::Segment,_std::allocator<tf::Segment>_>::size(pvVar6);
          local_258 = 0;
          while( true ) {
            uVar1 = local_258;
            pvVar4 = std::
                     vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                   *)(in_RDI + 0x18),local_138);
            pvVar6 = std::
                     vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     ::operator[](pvVar4,local_140);
            sVar3 = std::vector<tf::Segment,_std::allocator<tf::Segment>_>::size(pvVar6);
            if (sVar3 <= uVar1) break;
            pvVar4 = std::
                     vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                   *)(in_RDI + 0x18),local_138);
            pvVar6 = std::
                     vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                     ::operator[](pvVar4,local_140);
            local_260 = std::vector<tf::Segment,_std::allocator<tf::Segment>_>::operator[]
                                  (pvVar6,local_258);
            bVar2 = std::optional::operator_cast_to_bool
                              ((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                                *)0x11e0ad);
            if (bVar2) {
              std::
              optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
              ::operator*((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                           *)0x11e0c0);
              std::
              min<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                        (in_stack_fffffffffffffc58,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)0x11e0d4);
            }
            std::
            optional<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            ::operator=((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                         *)in_stack_fffffffffffffc70,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffc68);
            bVar2 = std::optional::operator_cast_to_bool
                              ((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                                *)0x11e126);
            if (bVar2) {
              std::
              optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
              ::operator*((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                           *)0x11e139);
              std::
              max<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                        (in_stack_fffffffffffffc58,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)0x11e14d);
            }
            std::
            optional<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            ::operator=((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                         *)in_stack_fffffffffffffc70,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffc68);
            local_288 = (rep)std::chrono::operator-
                                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                         *)in_stack_fffffffffffffc68,
                                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                         *)in_stack_fffffffffffffc60);
            local_280.__r =
                 (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (&in_stack_fffffffffffffc58->__d);
            local_278[0] = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_280)
            ;
            local_290 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                                  (&in_stack_fffffffffffffc60->tsum,
                                   (size_type)in_stack_fffffffffffffc58);
            local_290->count = local_290->count + 1;
            local_290->total_span = local_278[0] + local_290->total_span;
            if (local_290->count == 1) {
              local_318 = local_278[0];
            }
            else {
              puVar7 = std::min<unsigned_long>(local_278,&local_290->min_span);
              local_318 = *puVar7;
            }
            local_290->min_span = local_318;
            if (local_290->count == 1) {
              local_320 = local_278[0];
            }
            else {
              puVar7 = std::max<unsigned_long>(local_278,&local_290->max_span);
              local_320 = *puVar7;
            }
            local_290->max_span = local_320;
            local_238 = local_278[0] + local_238;
            if (local_258 == 0) {
              local_328 = local_278[0];
            }
            else {
              puVar7 = std::min<unsigned_long>(local_278,&local_230);
              local_328 = *puVar7;
            }
            local_230 = local_328;
            if (local_258 == 0) {
              local_330 = local_278[0];
            }
            else {
              puVar7 = std::max<unsigned_long>(local_278,local_228);
              local_330 = *puVar7;
            }
            local_228[0] = local_330;
            local_298 = std::array<tf::TFProfObserver::TaskSummary,_7UL>::operator[]
                                  (&in_stack_fffffffffffffc60->tsum,
                                   (size_type)in_stack_fffffffffffffc58);
            local_298->count = local_298->count + 1;
            local_298->total_span = local_278[0] + local_298->total_span;
            if (local_298->count == 1) {
              local_338 = local_278[0];
            }
            else {
              puVar7 = std::min<unsigned_long>(local_278,&local_298->min_span);
              local_338 = *puVar7;
            }
            local_298->min_span = local_338;
            if (local_298->count == 1) {
              local_340 = local_278[0];
            }
            else {
              puVar7 = std::max<unsigned_long>(local_278,&local_298->max_span);
              local_340 = *puVar7;
            }
            local_298->max_span = local_340;
            local_258 = local_258 + 1;
          }
          std::
          vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
          ::push_back((vector<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
                       *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
        }
        local_140 = local_140 + 1;
      }
    }
  }
  local_2a0 = 0;
  bVar2 = std::optional::operator_cast_to_bool
                    ((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                      *)0x11e540);
  if ((bVar2) &&
     (bVar2 = std::optional::operator_cast_to_bool
                        ((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                          *)0x11e556), bVar2)) {
    std::
    optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ::operator*((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                 *)0x11e569);
    std::
    optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ::operator*((optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
                 *)0x11e57b);
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffc68,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffc60);
    local_2a8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        (&in_stack_fffffffffffffc58->__d);
    local_2a0 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_2a8);
  }
  poVar8 = std::operator<<(local_10,"==Observer ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(ulong *)(in_RDI + 8));
  poVar8 = std::operator<<(poVar8,": ");
  sVar9 = num_workers(in_stack_fffffffffffffc70);
  this_00 = (TFProfObserver *)std::ostream::operator<<(poVar8,sVar9);
  poVar8 = std::operator<<((ostream *)this_00," workers completed ");
  sVar9 = num_tasks(this_00);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar9);
  this_01 = (Summary *)std::operator<<(poVar8," tasks in ");
  poVar8 = (ostream *)std::ostream::operator<<(this_01,local_2a0);
  std::operator<<(poVar8," us\n");
  Summary::dump(this_01,poVar8);
  Summary::~Summary((Summary *)0x11e6f4);
  return;
}

Assistant:

inline void TFProfObserver::summary(std::ostream& os) const {

  using namespace std::chrono;
  
  Summary summary;
  std::optional<observer_stamp_t> view_beg, view_end;

  // find the first non-empty worker
  size_t first;
  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    goto end_of_summary;
  }

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      // worker w at level l
      WorkerSummary ws;
      ws.id = w;
      ws.level = l;
      ws.count = _timeline.segments[w][l].size();
      
      // scan all tasks at level l
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {
        
        // update the entire span
        auto& s = _timeline.segments[w][l][i];
        view_beg = view_beg ? (std::min)(*view_beg, s.beg) : s.beg;
        view_end = view_end ? (std::max)(*view_end, s.end) : s.end;
        
        // update the task summary
        size_t t = duration_cast<microseconds>(s.end - s.beg).count();

        auto& x = summary.tsum[static_cast<int>(s.type)];
        x.count += 1;
        x.total_span += t;
        x.min_span = (x.count == 1) ? t : (std::min)(t, x.min_span);
        x.max_span = (x.count == 1) ? t : (std::max)(t, x.max_span);

        // update the worker summary
        ws.total_span += t;
        ws.min_span = (i == 0) ? t : (std::min)(t, ws.min_span);
        ws.max_span = (i == 0) ? t : (std::max)(t, ws.max_span);

        auto&y = ws.tsum[static_cast<int>(s.type)];
        y.count += 1;
        y.total_span += t;
        y.min_span = (y.count == 1) ? t : (std::min)(t, y.min_span);
        y.max_span = (y.count == 1) ? t : (std::max)(t, y.max_span);
        
        // update the delay
        //if(i) {
        //  size_t d = duration_cast<nanoseconds>(
        //    s.beg - _timeline.segments[w][l][i-1].end
        //  ).count();
        //  ws.total_delay += d;
        //  ws.min_delay = (i == 1) ? d : std::min(ws.min_delay, d);
        //  ws.max_delay = (i == 1) ? d : std::max(ws.max_delay, d);
        //}
      }
      summary.wsum.push_back(ws);
    }
  }

  end_of_summary:

  size_t view = 0;
  if(view_beg && view_end) {
    view = duration_cast<microseconds>(*view_end - *view_beg).count();
  }

  os << "==Observer " << _timeline.uid << ": "
     << num_workers() << " workers completed "
     << num_tasks() << " tasks in "
     << view << " us\n";

  summary.dump(os);
}